

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacklib.c
# Opt level: O3

char * tabexpand(char *sbuf)

{
  char cVar1;
  ulong uVar2;
  byte bVar3;
  char *__s;
  char *pcVar4;
  char buf [256];
  char local_138 [264];
  
  __s = local_138;
  cVar1 = *sbuf;
  if (cVar1 == '\0') {
    return sbuf;
  }
  pcVar4 = sbuf + 1;
  bVar3 = 0;
  do {
    if (cVar1 == '\t') {
      uVar2 = (ulong)((bVar3 ^ 7) & 7);
      memset(__s,0x20,uVar2 + 1);
      __s = __s + uVar2;
      bVar3 = bVar3 + ((bVar3 ^ 7) & 7);
    }
    else {
      if (cVar1 == '\0') {
        *__s = '\0';
        strcpy(sbuf,local_138);
        return sbuf;
      }
      *__s = cVar1;
    }
    bVar3 = bVar3 + 1;
    __s = __s + 1;
    cVar1 = *pcVar4;
    pcVar4 = pcVar4 + 1;
  } while( true );
}

Assistant:

char *tabexpand(char *sbuf)	/* expand tabs into proper number of spaces */
{
    char buf[BUFSZ];
    char *bp, *s = sbuf;
    int idx;

    if (!*s) return sbuf;

    /* warning: no bounds checking performed */
    for (bp = buf, idx = 0; *s; s++)
	if (*s == '\t') {
	    do *bp++ = ' '; while (++idx % 8);
	} else {
	    *bp++ = *s;
	    idx++;
	}
    *bp = 0;
    return strcpy(sbuf, buf);
}